

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * i2b(int i)

{
  Bigint *pBVar1;
  
  pBVar1 = (Bigint *)
           __ckd_malloc__(0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                          ,0x1a9);
  if (pBVar1 == (Bigint *)0x0) {
    pBVar1 = (Bigint *)0x0;
  }
  else {
    pBVar1->k = 1;
    pBVar1->maxwds = 2;
    pBVar1->sign = 0;
    pBVar1->wds = 0;
  }
  if (pBVar1 == (Bigint *)0x0) {
    pBVar1 = (Bigint *)0x0;
  }
  else {
    pBVar1->x[0] = i;
    pBVar1->wds = 1;
  }
  return pBVar1;
}

Assistant:

static Bigint *
i2b(int i)
{
    Bigint *b;

    b = Balloc(1);
    if (b == NULL)
        return NULL;
    b->x[0] = i;
    b->wds = 1;
    return b;
}